

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

size_t chck_buffer_read(void *dst,size_t size,size_t memb,chck_buffer *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint8_t *__n;
  
  if ((dst != (void *)0x0) && (buf != (chck_buffer *)0x0)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = memb;
    __n = SUB168(auVar1 * auVar2,0);
    if (SUB168(auVar1 * auVar2,8) == 0) {
      if (buf->buffer + (buf->size - (long)buf->curpos) < __n) {
        if (size == 0) {
          __assert_fail("size != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                        ,0x113,
                        "size_t chck_buffer_read(void *, size_t, size_t, struct chck_buffer *)");
        }
        memb = (ulong)(buf->buffer + (buf->size - (long)buf->curpos)) / size;
        __n = (uint8_t *)(memb * size);
      }
      memcpy(dst,buf->curpos,(size_t)__n);
      buf->curpos = buf->curpos + (long)__n;
    }
    else {
      memb = 0;
    }
    return memb;
  }
  __assert_fail("dst && buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x10c,"size_t chck_buffer_read(void *, size_t, size_t, struct chck_buffer *)");
}

Assistant:

size_t
chck_buffer_read(void *dst, size_t size, size_t memb, struct chck_buffer *buf)
{
   assert(dst && buf);

   size_t nsz;
   if (unlikely(chck_mul_ofsz(size, memb, &nsz)))
      return 0;

   if (unlikely(nsz > buf->size - (buf->curpos - buf->buffer))) {
      assert(size != 0); // should never happen
      // read as much as we can
      memb = (buf->size - (buf->curpos - buf->buffer)) / size;
   }

   memcpy(dst, buf->curpos, size * memb);
   buf->curpos += size * memb;
   return memb;
}